

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

DateCastResult
duckdb::Date::TryConvertDate
          (char *buf,idx_t len,idx_t *pos,date_t *result,bool *special,bool strict)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  int32_t local_4c;
  int32_t month;
  int32_t day;
  bool *local_40;
  ulong local_38;
  
  *special = false;
  *pos = 0;
  if (len != 0) {
    day = 0;
    month = -1;
    for (uVar8 = 1; uVar8 - 1 < len; uVar8 = uVar8 + 1) {
      bVar1 = buf[uVar8 - 1];
      if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        uVar4 = uVar8 - 1;
        bVar6 = bVar1;
        if (bVar1 == 0x2d) {
          *pos = uVar8;
          if (len <= uVar8) {
            return ERROR_INCORRECT_FORMAT;
          }
          bVar6 = buf[uVar8];
          uVar4 = uVar8;
        }
        if (9 < (byte)(bVar6 - 0x30)) {
          local_40 = special;
          bVar2 = TryConvertDateSpecial(buf,len,pos,PINF);
          if (bVar2) {
            iVar5 = (uint)(bVar1 == 0x2d) * 2 + 0x7fffffff;
          }
          else {
            bVar2 = TryConvertDateSpecial(buf,len,pos,EPOCH);
            iVar5 = 0;
            if (!bVar2) {
              return ERROR_INCORRECT_FORMAT;
            }
          }
          result->days = iVar5;
          uVar8 = *pos;
          while (((uVar8 < len && ((ulong)(byte)buf[uVar8] < 0x21)) &&
                 ((0x100003e00U >> ((ulong)(byte)buf[uVar8] & 0x3f) & 1) != 0))) {
            uVar8 = uVar8 + 1;
            *pos = uVar8;
          }
          *local_40 = true;
          return len != uVar8;
        }
        local_38 = 0;
        uVar8 = 0;
        while ((iVar5 = (int)local_38, uVar4 < len && ((byte)(buf[uVar4] - 0x30U) < 10))) {
          if (99999999 < iVar5) {
            return ERROR_RANGE;
          }
          local_38 = (ulong)((iVar5 * 10 + (uint)(byte)buf[uVar4]) - 0x30);
          uVar8 = uVar8 + 1;
          uVar4 = uVar4 + 1;
          *pos = uVar4;
        }
        if (uVar8 < 2 && strict) {
          return ERROR_INCORRECT_FORMAT;
        }
        uVar8 = (ulong)(uint)-iVar5;
        if (bVar1 != 0x2d) {
          uVar8 = local_38;
        }
        if (len <= uVar4) {
          return ERROR_INCORRECT_FORMAT;
        }
        *pos = uVar4 + 1;
        local_40 = (bool *)(ulong)(byte)buf[uVar4];
        uVar3 = (byte)buf[uVar4] - 0x20;
        if (0x3c < uVar3) {
          return ERROR_INCORRECT_FORMAT;
        }
        if ((0x100000000000a001U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          return ERROR_INCORRECT_FORMAT;
        }
        local_4c = (int32_t)uVar8;
        bVar2 = ParseDoubleDigit(buf,len,pos,&month);
        if (!bVar2) {
          return ERROR_INCORRECT_FORMAT;
        }
        uVar8 = *pos;
        if (len <= uVar8) {
          return ERROR_INCORRECT_FORMAT;
        }
        *pos = uVar8 + 1;
        if (len <= uVar8 + 1 || buf[uVar8] != (char)local_40) {
          return ERROR_INCORRECT_FORMAT;
        }
        bVar2 = ParseDoubleDigit(buf,len,pos,&day);
        if (bVar2) {
          uVar8 = *pos;
          if (((4 < len - uVar8) && ((ulong)(byte)buf[uVar8] < 0x21)) &&
             (((0x100003e00U >> ((ulong)(byte)buf[uVar8] & 0x3f) & 1) != 0 &&
              (buf[uVar8 + 1] == '(')))) {
            bVar6 = buf[uVar8 + 2];
            bVar7 = bVar6 | 0x20;
            if (0x19 < (byte)(bVar6 + 0xbf)) {
              bVar7 = bVar6;
            }
            if (bVar7 == 0x62) {
              bVar6 = buf[uVar8 + 3];
              bVar7 = bVar6 | 0x20;
              if (0x19 < (byte)(bVar6 + 0xbf)) {
                bVar7 = bVar6;
              }
              if ((bVar7 == 99) && (buf[uVar8 + 4] == ')')) {
                if (bVar1 == 0x2d) {
                  return ERROR_INCORRECT_FORMAT;
                }
                if (local_4c == 0) {
                  return ERROR_INCORRECT_FORMAT;
                }
                local_4c = 1 - (int)local_38;
                uVar8 = uVar8 + 5;
                *pos = uVar8;
              }
            }
          }
          if (strict) {
            while (uVar8 < len) {
              if (0x20 < (ulong)(byte)buf[uVar8]) {
                return ERROR_INCORRECT_FORMAT;
              }
              if ((0x100003e00U >> ((ulong)(byte)buf[uVar8] & 0x3f) & 1) == 0) {
                return ERROR_INCORRECT_FORMAT;
              }
              uVar8 = uVar8 + 1;
              *pos = uVar8;
            }
          }
          else if ((uVar8 < len) && ((byte)(buf[uVar8] - 0x30U) < 10)) {
            return ERROR_INCORRECT_FORMAT;
          }
          bVar2 = TryFromDate(local_4c,month,day,result);
          return !bVar2 * '\x02';
        }
        return ERROR_INCORRECT_FORMAT;
      }
      *pos = uVar8;
    }
  }
  return ERROR_INCORRECT_FORMAT;
}

Assistant:

DateCastResult Date::TryConvertDate(const char *buf, idx_t len, idx_t &pos, date_t &result, bool &special,
                                    bool strict) {
	special = false;
	pos = 0;
	if (len == 0) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	int32_t day = 0;
	int32_t month = -1;
	int32_t year = 0;
	bool yearneg = false;
	int sep;

	// skip leading spaces
	while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
		pos++;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}
	if (buf[pos] == '-') {
		yearneg = true;
		pos++;
		if (pos >= len) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
	}
	if (!StringUtil::CharacterIsDigit(buf[pos])) {
		// Check for special values
		if (TryConvertDateSpecial(buf, len, pos, PINF)) {
			result = yearneg ? date_t::ninfinity() : date_t::infinity();
		} else if (TryConvertDateSpecial(buf, len, pos, EPOCH)) {
			result = date_t::epoch();
		} else {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
		// skip trailing spaces - parsing must be strict here
		while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
			pos++;
		}
		special = true;
		return (pos == len) ? DateCastResult::SUCCESS : DateCastResult::ERROR_INCORRECT_FORMAT;
	}
	// first parse the year
	idx_t year_length = 0;
	for (; pos < len && StringUtil::CharacterIsDigit(buf[pos]); pos++) {
		if (year >= 100000000) {
			return DateCastResult::ERROR_RANGE;
		}
		year = (buf[pos] - '0') + year * 10;
		year_length++;
	}
	if (year_length < 2 && strict) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}
	if (yearneg) {
		year = -year;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// fetch the separator
	sep = buf[pos++];
	if (sep != ' ' && sep != '-' && sep != '/' && sep != '\\') {
		// invalid separator
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// parse the month
	if (!Date::ParseDoubleDigit(buf, len, pos, month)) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	if (buf[pos++] != sep) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// now parse the day
	if (!Date::ParseDoubleDigit(buf, len, pos, day)) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// check for an optional trailing " (BC)""
	if (len - pos >= 5 && StringUtil::CharacterIsSpace(buf[pos]) && buf[pos + 1] == '(' &&
	    StringUtil::CharacterToLower(buf[pos + 2]) == 'b' && StringUtil::CharacterToLower(buf[pos + 3]) == 'c' &&
	    buf[pos + 4] == ')') {
		if (yearneg || year == 0) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
		year = -year + 1;
		pos += 5;
	}

	// in strict mode, check remaining string for non-space characters
	if (strict) {
		// skip trailing spaces
		while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
			pos++;
		}
		// check position. if end was not reached, non-space chars remaining
		if (pos < len) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
	} else {
		// in non-strict mode, check for any direct trailing digits
		if (pos < len && StringUtil::CharacterIsDigit(buf[pos])) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
	}

	return Date::TryFromDate(year, month, day, result) ? DateCastResult::SUCCESS : DateCastResult::ERROR_RANGE;
}